

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O2

void __thiscall
dtc::fdt::checking::check_manager::
add_property_type_checker<(dtc::fdt::property_value::value_type)1>
          (check_manager *this,char *name,string *prop)

{
  property_type_checker<(dtc::fdt::property_value::value_type)1> *this_00;
  allocator<char> local_69;
  uint *local_68;
  undefined8 local_60;
  uint local_58 [2];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uint *local_48;
  undefined8 local_40;
  uint local_38 [2];
  undefined4 uStack_30;
  undefined4 uStack_2c;
  property_type_checker<(dtc::fdt::property_value::value_type)1> *local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,name,&local_69);
  this_00 = (property_type_checker<(dtc::fdt::property_value::value_type)1> *)operator_new(0x48);
  property_type_checker<(dtc::fdt::property_value::value_type)1>::property_type_checker
            (this_00,name,prop);
  local_40 = local_60;
  local_48 = local_38;
  if (local_68 == local_58) {
    uStack_30 = uStack_50;
    uStack_2c = uStack_4c;
  }
  else {
    local_48 = local_68;
  }
  local_60 = 0;
  local_58[0] = local_58[0] & 0xffffff00;
  local_68 = local_58;
  local_28 = this_00;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string,dtc::fdt::checking::property_type_checker<(dtc::fdt::property_value::value_type)1>*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void
check_manager::add_property_type_checker(const char *name, const string &prop)
{
	checkers.insert(std::make_pair(string(name),
		new property_type_checker<T>(name, prop)));
}